

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

void google::protobuf::compiler::php::GenerateServiceFile
               (FileDescriptor *file,ServiceDescriptor *service,bool is_descriptor,
               GeneratorContext *generator_context)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined7 in_register_00000011;
  int i;
  long lVar3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string fullname;
  string filename;
  Printer printer;
  ZeroCopyOutputStream *output;
  
  GeneratedServiceFileName_abi_cxx11_
            (&filename,(php *)service,
             (ServiceDescriptor *)CONCAT71(in_register_00000011,is_descriptor),
             SUB81(generator_context,0));
  iVar2 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&filename);
  output = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar2);
  io::Printer::Printer(&printer,output,'^');
  GenerateHead(file,&printer);
  FilenameToClassname(&fullname,&filename);
  iVar2 = std::__cxx11::string::find_last_of((char *)&fullname,0x38d6ed);
  if (*(long *)(*(long *)(*(long *)(file + 0x88) + 0x80) + 8) == 0) {
    if ((*(byte *)(*(long *)(file + 0x88) + 0x28) & 0x80) == 0) {
      if ((iVar2 == -1) && (*(long *)(*(long *)(file + 8) + 8) == 0)) goto LAB_002a2358;
    }
    else if (iVar2 == -1) goto LAB_002a2358;
  }
  std::__cxx11::string::substr((ulong)&local_130,(ulong)&fullname);
  io::Printer::Print<char[5],std::__cxx11::string>
            (&printer,"namespace ^name^;\n\n",(char (*) [5])0x38d8c6,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
LAB_002a2358:
  GenerateServiceDocComment(&printer,service);
  if (iVar2 == -1) {
    io::Printer::Print<char[5],std::__cxx11::string>
              (&printer,"interface ^name^\n{\n",(char (*) [5])0x38d8c6,&fullname);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_130,(ulong)&fullname);
    io::Printer::Print<char[5],std::__cxx11::string>
              (&printer,"interface ^name^\n{\n",(char (*) [5])0x38d8c6,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
  }
  Indent(&printer);
  lVar4 = 0;
  for (lVar3 = 0; lVar3 < *(int *)(service + 0x28); lVar3 = lVar3 + 1) {
    lVar1 = *(long *)(service + 0x20);
    GenerateServiceMethodDocComment(&printer,(MethodDescriptor *)(lVar1 + lVar4));
    GenerateServiceMethod((MethodDescriptor *)(lVar1 + lVar4),&printer);
    lVar4 = lVar4 + 0x68;
  }
  Outdent(&printer);
  io::Printer::Print<>(&printer,"}\n\n");
  std::__cxx11::string::~string((string *)&fullname);
  io::Printer::~Printer(&printer);
  if (output != (ZeroCopyOutputStream *)0x0) {
    (*output->_vptr_ZeroCopyOutputStream[1])(output);
  }
  std::__cxx11::string::~string((string *)&filename);
  return;
}

Assistant:

void GenerateServiceFile(const FileDescriptor* file,
  const ServiceDescriptor* service, bool is_descriptor,
  GeneratorContext* generator_context) {
  std::string filename = GeneratedServiceFileName(service, is_descriptor);
  std::unique_ptr<io::ZeroCopyOutputStream> output(
      generator_context->Open(filename));
  io::Printer printer(output.get(), '^');

  GenerateHead(file, &printer);

  std::string fullname = FilenameToClassname(filename);
  int lastindex = fullname.find_last_of("\\");

  if (!file->options().php_namespace().empty() ||
      (!file->options().has_php_namespace() && !file->package().empty()) ||
      lastindex != string::npos) {
    printer.Print(
        "namespace ^name^;\n\n",
        "name", fullname.substr(0, lastindex));
  }

  GenerateServiceDocComment(&printer, service);

  if (lastindex != string::npos) {
      printer.Print(
        "interface ^name^\n"
        "{\n",
        "name", fullname.substr(lastindex + 1));
  } else {
      printer.Print(
        "interface ^name^\n"
        "{\n",
        "name", fullname);
  }

  Indent(&printer);

  for (int i = 0; i < service->method_count(); i++) {
    const MethodDescriptor* method = service->method(i);
    GenerateServiceMethodDocComment(&printer, method);
    GenerateServiceMethod(method, &printer);
  }

  Outdent(&printer);
  printer.Print("}\n\n");
}